

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

lyxp_set * set_copy(lyxp_set *set)

{
  uint32_t uVar1;
  int iVar2;
  lyxp_set_node *plVar3;
  hash_table *phVar4;
  char *pcVar5;
  ushort local_22;
  uint16_t i;
  lyxp_set *ret;
  lyxp_set *set_local;
  
  if (set == (lyxp_set *)0x0) {
    set_local = (lyxp_set *)0x0;
  }
  else {
    set_local = (lyxp_set *)malloc(0x40);
    if (set_local == (lyxp_set *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","set_copy");
      set_local = (lyxp_set *)0x0;
    }
    else if (set->type == LYXP_SET_SNODE_SET) {
      memset(set_local,0,0x40);
      set_local->type = set->type;
      for (local_22 = 0; (uint)local_22 < set->used; local_22 = local_22 + 1) {
        if (((set->val).nodes[local_22].pos == 1) &&
           (iVar2 = set_snode_insert_node
                              (set_local,(lys_node *)(set->val).nodes[local_22].node,
                               (set->val).nodes[local_22].type), iVar2 != 0)) {
          lyxp_set_free(set_local);
          return (lyxp_set *)0x0;
        }
      }
    }
    else if (set->type == LYXP_SET_NODE_SET) {
      set_local->type = set->type;
      plVar3 = (lyxp_set_node *)malloc((ulong)set->used << 4);
      (set_local->val).nodes = plVar3;
      if ((set_local->val).nodes == (lyxp_set_node *)0x0) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","set_copy");
        free(set_local);
        set_local = (lyxp_set *)0x0;
      }
      else {
        memcpy((set_local->val).nodes,(set->val).nodes,(ulong)set->used << 4);
        uVar1 = set->used;
        set_local->size = uVar1;
        set_local->used = uVar1;
        set_local->ctx_pos = set->ctx_pos;
        set_local->ctx_size = set->ctx_size;
        phVar4 = lyht_dup(set->ht);
        set_local->ht = phVar4;
      }
    }
    else {
      memcpy(set_local,set,0x40);
      if (set->type == LYXP_SET_STRING) {
        pcVar5 = strdup((set->val).str);
        (set_local->val).str = pcVar5;
        if ((set_local->val).nodes == (lyxp_set_node *)0x0) {
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","set_copy");
          free(set_local);
          set_local = (lyxp_set *)0x0;
        }
      }
    }
  }
  return set_local;
}

Assistant:

static struct lyxp_set *
set_copy(struct lyxp_set *set)
{
    struct lyxp_set *ret;
    uint16_t i;

    if (!set) {
        return NULL;
    }

    ret = malloc(sizeof *ret);
    LY_CHECK_ERR_RETURN(!ret, LOGMEM(NULL), NULL);

    if (set->type == LYXP_SET_SNODE_SET) {
        memset(ret, 0, sizeof *ret);
        ret->type = set->type;

        for (i = 0; i < set->used; ++i) {
            if (set->val.snodes[i].in_ctx == 1) {
                if (set_snode_insert_node(ret, set->val.snodes[i].snode, set->val.snodes[i].type)) {
                    lyxp_set_free(ret);
                    return NULL;
                }
            }
        }
    } else if (set->type == LYXP_SET_NODE_SET) {
        ret->type = set->type;
        ret->val.nodes = malloc(set->used * sizeof *ret->val.nodes);
        LY_CHECK_ERR_RETURN(!ret->val.nodes, LOGMEM(NULL); free(ret), NULL);
        memcpy(ret->val.nodes, set->val.nodes, set->used * sizeof *ret->val.nodes);

        ret->used = ret->size = set->used;
        ret->ctx_pos = set->ctx_pos;
        ret->ctx_size = set->ctx_size;

#ifdef LY_ENABLED_CACHE
        ret->ht = lyht_dup(set->ht);
#endif
    } else {
       memcpy(ret, set, sizeof *ret);
       if (set->type == LYXP_SET_STRING) {
           ret->val.str = strdup(set->val.str);
           LY_CHECK_ERR_RETURN(!ret->val.str, LOGMEM(NULL); free(ret), NULL);
       }
    }

    return ret;
}